

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O2

void __thiscall Potassco::Application::printHelp(Application *this,OptionContext *root)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  size_t sVar3;
  string local_70;
  FileOut out;
  
  iVar1 = (**this->_vptr_Application)();
  iVar2 = (*this->_vptr_Application[1])(this);
  printf("%s version %s\n",CONCAT44(extraout_var,iVar1),CONCAT44(extraout_var_00,iVar2));
  (*this->_vptr_Application[0xb])(this);
  out.super_OptionOutput._vptr_OptionOutput = (_func_int **)&PTR__OptionOutputImpl_0012a188;
  out.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  out.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  out.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  out.writer_.out = (FILE *)_stdout;
  ProgramOptions::OptionContext::description(root,&out.super_OptionOutput);
  putchar(10);
  (*this->_vptr_Application[0xb])(this);
  iVar1 = (**this->_vptr_Application)(this);
  iVar2 = (**this->_vptr_Application)(this);
  sVar3 = strlen((char *)CONCAT44(extraout_var_02,iVar2));
  ProgramOptions::OptionContext::defaults_abi_cxx11_(&local_70,root,sVar3 + 1);
  printf("Default command-line:\n%s %s\n",CONCAT44(extraout_var_01,iVar1),local_70._M_dataplus._M_p)
  ;
  std::__cxx11::string::~string((string *)&local_70);
  fflush(_stdout);
  ProgramOptions::
  OptionOutputImpl<Potassco::ProgramOptions::FileWriter,_Potassco::ProgramOptions::DefaultFormat>::
  ~OptionOutputImpl(&out);
  return;
}

Assistant:

void Application::printHelp(const OptionContext& root) {
	printf("%s version %s\n", getName(), getVersion());
	printUsage();
	ProgramOptions::FileOut out(stdout);
	root.description(out);
	printf("\n");
	printUsage();
	printf("Default command-line:\n%s %s\n", getName(), root.defaults(strlen(getName())+1).c_str());
	fflush(stdout);
}